

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedRead::writeWithFds
          (BlockedRead *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  size_t *psVar1;
  uint uVar2;
  int iVar3;
  int osErrorNumber;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  BlockedRead *this_00;
  size_t in_R9;
  bool bVar7;
  ArrayPtr<const_unsigned_char> data_00;
  ArrayPtr<const_unsigned_char> data_01;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData_01;
  DebugExpression<bool> _kjCondition;
  undefined3 uStack_a3;
  Fault f;
  anon_union_32_1_a8a2e026_for_OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>_2
  local_98 [3];
  size_t extraout_RDX;
  
  moreData_01.ptr = (ArrayPtr<const_unsigned_char> *)moreData.size_;
  data_01.size_ = moreData.ptr;
  data_01.ptr = (uchar *)data.size_;
  this_00 = (BlockedRead *)data.ptr;
  bVar7 = (this_00->canceler).list.ptr == (AdapterBase *)0x0;
  _kjCondition.value = bVar7;
  if (!bVar7) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3f0,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  uVar2 = (this_00->capBuffer).tag;
  if (uVar2 == 2) {
    if ((*(long *)((long)&(this_00->capBuffer).field_1 + 8) != 0) && (fds.size_ != 0)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[130]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x404,FAILED,(char *)0x0,
                 "\"async pipe message was written with FDs attached, but corresponding read \" \"asked for streams, and we don\'t know how to convert here\""
                 ,(char (*) [130])
                  "async pipe message was written with FDs attached, but corresponding read asked for streams, and we don\'t know how to convert here"
                );
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  else if (uVar2 == 1) {
    uVar6 = *(ulong *)((long)&(this_00->capBuffer).field_1 + 8);
    if (fds.size_ < uVar6) {
      fds.size_ = uVar6;
    }
    for (uVar6 = 0; uVar6 != fds.size_; uVar6 = uVar6 + 1) {
      do {
        iVar3 = dup(fds.ptr[uVar6]);
        if (-1 < iVar3) goto LAB_0036ed8a;
        osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
      } while (osErrorNumber == -1);
      if (osErrorNumber != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x3fa,osErrorNumber,"_kj_fd = dup(fds[i])","");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_0036ed8a:
      __kjCondition = iVar3;
      OwnFd::operator=((OwnFd *)(uVar6 * 4 + *(long *)&(this_00->capBuffer).field_1),
                       (OwnFd *)&_kjCondition);
      OwnFd::~OwnFd((OwnFd *)&_kjCondition);
    }
    local_98[0]._0_8_ = fds.size_ * 4 + *(long *)&(this_00->capBuffer).field_1;
    local_98[0]._8_8_ = *(long *)((long)&(this_00->capBuffer).field_1 + 8) - fds.size_;
    f.exception._0_4_ = 1;
    OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
    ::operator=(&this_00->capBuffer,
                (OneOf<kj::ArrayPtr<kj::OwnFd>,_kj::ArrayPtr<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
                 *)&f);
    psVar1 = &(this_00->readSoFar).capCount;
    *psVar1 = *psVar1 + fds.size_;
  }
  moreData_01.size_ = in_R9;
  writeImpl((OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedRead::Retry>
             *)&f,this_00,data_01,moreData_01);
  if ((int)f.exception == 2) {
    uVar4 = 1;
  }
  else {
    uVar5 = (int)f.exception - 1;
    local_98[0]._8_8_ = ZEXT48(uVar5);
    local_98[0]._0_8_ = extraout_RDX;
    local_98[0]._16_8_ = moreData_01.ptr;
    uVar4 = 0;
    if (1 < uVar5) {
      uVar4 = uVar5;
    }
  }
  if (uVar4 == 1) {
    data_00.size_ = local_98[0]._0_8_;
    data_00.ptr = (uchar *)this_00->pipe;
    moreData_00.size_ = local_98[0]._16_8_;
    moreData_00.ptr = (ArrayPtr<const_unsigned_char> *)local_98[0]._8_8_;
    AsyncPipe::writeWithFds((AsyncPipe *)this,data_00,moreData_00,(ArrayPtr<const_int>)ZEXT816(0));
  }
  else {
    if (uVar4 != 0) {
      kj::_::unreachable();
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}